

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O2

void __thiscall C3DFile::readPointSection(C3DFile *this,ifstream *datastream)

{
  vector<FloatMarkerData,_std::allocator<FloatMarkerData>_> *this_00;
  Uint16 UVar1;
  Uint16 UVar2;
  ushort uVar3;
  reference this_01;
  size_type __n;
  uint uVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  vector<FramePointInfo,_std::allocator<FramePointInfo>_> frame_data;
  FloatMarkerData marker_data;
  
  fVar7 = getParamFloat(this,"POINT:SCALE");
  fVar9 = -fVar7;
  this->uses_integer_data = fVar9 <= fVar7;
  uVar3 = getParamSint16(this,"POINT:DATA_START");
  if (2 < (short)uVar3) {
    if (fVar9 <= fVar7) {
      fVar9 = fVar7;
    }
    std::istream::seekg((long)datastream,(uint)uVar3 * 0x200 - 0x200);
    uVar3 = getParamSint16(this,"POINT:USED");
    UVar1 = (this->header).last_frame;
    UVar2 = (this->header).first_frame;
    this_00 = &this->float_point_data;
    if ((short)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar4 = (uint)uVar3;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      marker_data.cameras.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      marker_data.cameras.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      marker_data.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      marker_data.cameras.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      marker_data.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      marker_data.z.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      marker_data.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      marker_data.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      marker_data.y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      marker_data.residual.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::push_back
                (this_00,&marker_data);
      frame_data.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      frame_data.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      frame_data.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
      ::push_back(&this->point_data,
                  (value_type *)
                  &frame_data.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>);
      std::_Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>::~_Vector_base
                (&frame_data.super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>);
      FloatMarkerData::~FloatMarkerData(&marker_data);
    }
    for (uVar4 = 0; uVar4 != (ushort)((UVar1 - UVar2) + 1); uVar4 = uVar4 + 1) {
      __n = 0;
      for (lVar5 = 0; (ulong)uVar3 * 0x78 - lVar5 != 0; lVar5 = lVar5 + 0x78) {
        if (this->uses_integer_data == false) {
          std::istream::read((char *)datastream,(long)&marker_data);
        }
        else {
          std::istream::read((char *)datastream,(long)&frame_data);
          auVar8 = pshuflw(ZEXT416((uint)frame_data.
                                         super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                           ZEXT416((uint)frame_data.
                                         super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start),0x60);
          marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44((float)(auVar8._4_4_ >> 0x10) * fVar9,
                                 (float)(auVar8._0_4_ >> 0x10) * fVar9);
          marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_6_ =
               CONCAT24(frame_data.
                        super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>._M_impl.
                        super__Vector_impl_data._M_start._6_2_,
                        (float)(int)frame_data.
                                    super__Vector_base<FramePointInfo,_std::allocator<FramePointInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_2_ * fVar9);
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>).
                             _M_impl.super__Vector_impl_data._M_start)->x).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl + lVar5),
                   (value_type_conflict1 *)&marker_data);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>).
                             _M_impl.super__Vector_impl_data._M_start)->y).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl + lVar5),
                   (value_type_conflict1 *)
                   ((long)&marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + 4));
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>).
                             _M_impl.super__Vector_impl_data._M_start)->z).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl + lVar5),
                   (value_type_conflict1 *)
                   &marker_data.x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>).
                             _M_impl.super__Vector_impl_data._M_start)->cameras).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar5),(value_type_conflict2 *)
                            ((long)&marker_data.x.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 4));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>).
                             _M_impl.super__Vector_impl_data._M_start)->residual).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + lVar5),(value_type_conflict2 *)
                            ((long)&marker_data.x.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 5));
        this_01 = std::
                  vector<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>,_std::allocator<std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>_>_>
                  ::at(&this->point_data,__n);
        std::vector<FramePointInfo,_std::allocator<FramePointInfo>_>::push_back
                  (this_01,(value_type *)&marker_data);
        __n = __n + 1;
      }
      std::istream::seekg((long)datastream,(uint)(this->header).analog_channels << 2);
    }
    return;
  }
  __assert_fail("data_start > 512",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x12f,"void C3DFile::readPointSection(ifstream &)");
}

Assistant:

void C3DFile::readPointSection(ifstream &datastream) {
	float point_scale = getParamFloat("POINT:SCALE");

	//Check point scale value to figure out if the data is stored in integer or floating point format
	//if point_scale is negative the floating point format is used, other wise the integer format
	if (point_scale < 0.) {
		uses_integer_data = false;
		point_scale *= -1.;
	} else {
		uses_integer_data = true;
	}

	// compute the start of the point data
	int data_start = getParamSint16 ("POINT:DATA_START");
	data_start = 512 * ( data_start - 1);
		
	assert (data_start > 512);

	datastream.seekg(data_start, ios::beg);

	Sint16 point_count = getParamSint16("POINT:USED");

	Uint16 frame_count = header.last_frame - header.first_frame + 1;

	/*
	float video_frame_rate = header.video_sampling_rate;
	float analog_frame_rate = header.video_sampling_rate * header.analog_channels_samples;
	Uint16 analog_channel_count = header.analog_channels;

	cout << endl;
	cout << "Frame Count       = " << frame_count << endl;
	cout << "Video Frame Rate  = " << video_frame_rate << endl;
	cout << "Analog Frame Rate = " << analog_frame_rate << endl;
	cout << "Analog channels   = " << analog_channel_count / header.analog_channels_samples << endl;
	cout << endl;
	*/

	// Populate point_data
	int i;
	for (i = 0; i < point_count; i++) {
		FloatMarkerData marker_data;
		float_point_data.push_back(marker_data);
		std::vector<FramePointInfo> frame_data;
		point_data.push_back(frame_data);
	}

	unsigned int frame_index;

	for (frame_index = 0; frame_index < frame_count; frame_index ++) {
		// Read the frames
		for (i = 0; i < point_count; i++) {
			//read data from float data section
			if (!uses_integer_data) {
				FramePointInfo point_info;
				datastream.read(reinterpret_cast<char *>(&point_info), sizeof(FramePointInfo));

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			//read data from int data section
			} else {
				FramePointIntInfo int_point_info;
				datastream.read(reinterpret_cast<char *>(&int_point_info), sizeof(FramePointIntInfo));

				FramePointInfo point_info;
				point_info.x = point_scale * int_point_info.x;
				point_info.y = point_scale * int_point_info.y;
				point_info.z = point_scale * int_point_info.z;
				point_info.cameras = int_point_info.cameras;
				point_info.residual = int_point_info.residual;

				float_point_data[i].x.push_back(point_info.x);
				float_point_data[i].y.push_back(point_info.y);
				float_point_data[i].z.push_back(point_info.z);

			    float_point_data[i].cameras.push_back(point_info.cameras);
			    float_point_data[i].residual.push_back(point_info.residual);

				point_data.at(i).push_back(point_info);
			}
		}

		datastream.seekg((header.analog_channels) * sizeof(float), ios::cur);
	}
}